

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O2

void __thiscall
IO::momentsActive(IO *this,vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *sims,
                 string *filename)

{
  pointer ppMVar1;
  ModelInstance *pMVar2;
  float *pfVar3;
  ostream *poVar4;
  float *pfVar5;
  pointer ppMVar6;
  ofstream outstream;
  
  std::ofstream::ofstream((string *)&outstream);
  std::ofstream::open((string *)&outstream,(_Ios_Openmode)filename);
  ppMVar1 = (sims->super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppMVar6 = (sims->super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppMVar6 != ppMVar1; ppMVar6 = ppMVar6 + 1
      ) {
    pMVar2 = *ppMVar6;
    pfVar3 = (pMVar2->dimersactive)._M_elems[0].super__Vector_base<float,_std::allocator<float>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pfVar5 = (pMVar2->dimersactive)._M_elems[0].
                  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                  _M_start; pfVar5 != pfVar3; pfVar5 = pfVar5 + 1) {
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&outstream,*pfVar5);
      std::operator<<(poVar4,"\t");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&outstream);
    pfVar3 = (pMVar2->dimersactive)._M_elems[1].super__Vector_base<float,_std::allocator<float>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pfVar5 = (pMVar2->dimersactive)._M_elems[1].
                  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                  _M_start; pfVar5 != pfVar3; pfVar5 = pfVar5 + 1) {
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&outstream,*pfVar5);
      std::operator<<(poVar4,"\t");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&outstream);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&outstream);
  return;
}

Assistant:

void IO::momentsActive(std::vector<ModelInstance*> sims, std::string filename){
	std::ofstream outstream;
	outstream.open(filename, std::ios::app);
	for (ModelInstance* model: sims){
		for (auto i: model->dimersactive.at(0)){
			outstream << i << "\t";
		}
		outstream << std::endl;
		for (auto i: model->dimersactive.at(1)){
			outstream << i << "\t";
		}
		outstream << std::endl;
	}
	outstream.close();
}